

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O3

void Saig_StrSimPrepareAig(Aig_Man_t *p)

{
  undefined4 *puVar1;
  undefined1 auVar2 [16];
  void *pvVar3;
  int *piVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  Vec_Ptr_t *pVVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  long lVar13;
  
  Aig_ManReprStart(p,p->vObjs->nSize);
  pVVar9 = p->vObjs;
  iVar5 = pVVar9->nSize;
  lVar8 = (long)iVar5;
  pvVar3 = malloc(lVar8 * 0x48);
  auVar2 = _DAT_0093d220;
  if (0 < lVar8) {
    lVar7 = lVar8 + -1;
    auVar10._8_4_ = (int)lVar7;
    auVar10._0_8_ = lVar7;
    auVar10._12_4_ = (int)((ulong)lVar7 >> 0x20);
    lVar7 = 0;
    auVar10 = auVar10 ^ _DAT_0093d220;
    auVar11 = _DAT_0093d210;
    do {
      auVar12 = auVar11 ^ auVar2;
      lVar13 = auVar11._8_8_;
      if ((bool)(~(auVar12._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar12._0_4_ ||
                  auVar10._4_4_ < auVar12._4_4_) & 1)) {
        *(long *)((long)pvVar3 + lVar7) = (long)pvVar3 + auVar11._0_8_ * 0x40 + lVar8 * 8;
      }
      if ((auVar12._12_4_ != auVar10._12_4_ || auVar12._8_4_ <= auVar10._8_4_) &&
          auVar12._12_4_ <= auVar10._12_4_) {
        *(long *)((long)pvVar3 + lVar7 + 8) = (long)pvVar3 + lVar13 * 0x40 + lVar8 * 8;
      }
      auVar11._0_8_ = auVar11._0_8_ + 2;
      auVar11._8_8_ = lVar13 + 2;
      lVar7 = lVar7 + 0x10;
    } while ((ulong)(iVar5 + 1U >> 1) << 4 != lVar7);
  }
  piVar4 = (int *)malloc(0x10);
  piVar4[1] = iVar5;
  *piVar4 = iVar5;
  *(void **)(piVar4 + 2) = pvVar3;
  p->pData2 = piVar4;
  if (0 < iVar5) {
    lVar8 = 0;
    do {
      if (pVVar9->pArray[lVar8] != (void *)0x0) {
        if (*(int *)((long)p->pData2 + 4) <= lVar8) goto LAB_006f63ea;
        *(undefined8 *)((long)pVVar9->pArray[lVar8] + 0x28) =
             *(undefined8 *)(*(long *)((long)p->pData2 + 8) + lVar8 * 8);
        pVVar9 = p->vObjs;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar9->nSize);
  }
  puVar1 = (undefined4 *)(p->pConst1->field_5).pData;
  puVar1[0xc] = 0xffffffff;
  puVar1[0xd] = 0xffffffff;
  puVar1[0xe] = 0xffffffff;
  puVar1[0xf] = 0xffffffff;
  puVar1[8] = 0xffffffff;
  puVar1[9] = 0xffffffff;
  puVar1[10] = 0xffffffff;
  puVar1[0xb] = 0xffffffff;
  puVar1[4] = 0xffffffff;
  puVar1[5] = 0xffffffff;
  puVar1[6] = 0xffffffff;
  puVar1[7] = 0xffffffff;
  *puVar1 = 0xffffffff;
  puVar1[1] = 0xffffffff;
  puVar1[2] = 0xffffffff;
  puVar1[3] = 0xffffffff;
  if (0 < p->nRegs) {
    pVVar9 = p->vCis;
    iVar5 = 0;
    do {
      uVar6 = p->nTruePis + iVar5;
      if (((int)uVar6 < 0) || (pVVar9->nSize <= (int)uVar6)) {
LAB_006f63ea:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      **(undefined4 **)((long)pVVar9->pArray[uVar6] + 0x28) = 0;
      iVar5 = iVar5 + 1;
    } while (iVar5 < p->nRegs);
  }
  return;
}

Assistant:

void Saig_StrSimPrepareAig( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManReprStart( p, Aig_ManObjNumMax(p) );
    // allocate simulation info
    p->pData2 = Vec_PtrAllocSimInfo( Aig_ManObjNumMax(p), SAIG_WORDS );
    Aig_ManForEachObj( p, pObj, i )
        pObj->pData = Vec_PtrEntry( (Vec_Ptr_t *)p->pData2, i );
    // set simulation info for constant1 and register outputs
    Saig_StrSimAssignOne( Aig_ManConst1(p) );
    Saig_ManForEachLo( p, pObj, i )
        Saig_StrSimAssignZeroInit( pObj );
}